

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

int Abc_NodeMakeLegit(Abc_Obj_t *pNode)

{
  int fChanges;
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  do {
    Abc_NodeMakeDist1Free(pNode);
    iVar1 = Abc_NodeMakeSCCFree(pNode);
    iVar2 = iVar2 + -1;
  } while (iVar1 != 0);
  return (uint)(iVar2 != 0);
}

Assistant:

int Abc_NodeMakeLegit( Abc_Obj_t * pNode )
{
    int i, fChanges = 1;
    for ( i = 0; fChanges; i++ )
    {
        Abc_NodeMakeDist1Free( pNode );
        fChanges = Abc_NodeMakeSCCFree( pNode );
    }
//    Abc_NodeCheckDist1Free( pNode );
    return i > 1;
}